

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::ReadControllerWeights(ColladaParser *this,Controller *pController)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *__s1;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  InputChannel *this_00;
  ulong *puVar6;
  size_type __new_size;
  pointer ppVar7;
  InputChannel channel;
  string local_220;
  undefined1 local_200 [24];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  Accessor *local_1c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1c0;
  InputChannel *local_1b8;
  InputChannel *local_1b0;
  string local_1a8 [11];
  undefined4 extraout_var;
  
  uVar2 = GetAttribute(this,"count");
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar2);
  local_1c0 = &pController->mWeightCounts;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_1c0,(long)iVar3);
  local_1b8 = &pController->mWeightInputWeights;
  local_1b0 = &pController->mWeightInputJoints;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
            if ((char)iVar4 == '\0') {
              return;
            }
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar4 == 1) break;
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar4 == 2) {
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"vertex_weights");
              if (iVar3 == 0) {
                return;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1a8,"Expected end of <vertex_weights> element.",
                         (allocator<char> *)local_200);
              ThrowException(this,local_1a8);
            }
          }
          bVar1 = IsElement(this,"input");
          if ((iVar3 == 0) || (!bVar1)) break;
          local_1e8._M_p = (pointer)&local_1d8;
          local_1e0 = 0;
          local_1d8._M_local_buf[0] = '\0';
          local_200._0_8_ = local_200._0_8_ & 0xffffffff00000000;
          local_1c8 = (Accessor *)0x0;
          local_200._8_8_ = 0;
          local_200._16_8_ = 0;
          uVar2 = GetAttribute(this,"semantic");
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
          __s1 = (char *)CONCAT44(extraout_var,iVar4);
          uVar2 = GetAttribute(this,"source");
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
          uVar2 = TestAttribute(this,"offset");
          if (-1 < (int)uVar2) {
            iVar5 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar2);
            local_200._16_8_ = SEXT48(iVar5);
          }
          if (*(char *)CONCAT44(extraout_var_00,iVar4) != '#') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::operator<<((ostream *)local_1a8,"Unsupported URL format in \"");
            std::operator<<((ostream *)local_1a8,(char *)CONCAT44(extraout_var_00,iVar4));
            std::operator<<((ostream *)local_1a8,
                            "\" in source attribute of <vertex_weights> data <input> element");
            std::__cxx11::stringbuf::str();
            ThrowException(this,&local_220);
          }
          std::__cxx11::string::assign((char *)&local_1e8);
          iVar4 = strcmp(__s1,"JOINT");
          this_00 = local_1b0;
          if ((iVar4 != 0) && (iVar4 = strcmp(__s1,"WEIGHT"), this_00 = local_1b8, iVar4 != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::operator<<((ostream *)local_1a8,"Unknown semantic \"");
            std::operator<<((ostream *)local_1a8,__s1);
            std::operator<<((ostream *)local_1a8,"\" in <vertex_weights> data <input> element");
            std::__cxx11::stringbuf::str();
            ThrowException(this,&local_220);
          }
          Collada::InputChannel::operator=(this_00,(InputChannel *)local_200);
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((char)iVar4 == '\0') {
            SkipElement(this);
          }
          std::__cxx11::string::~string((string *)&local_1e8);
        }
        bVar1 = IsElement(this,"vcount");
        if ((iVar3 == 0) || (!bVar1)) break;
        local_200._0_8_ = GetTextContent(this);
        __new_size = 0;
        for (puVar6 = (local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar6 != (pController->mWeightCounts).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
          if (*(char *)local_200._0_8_ == '\0') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1a8,"Out of data while reading <vcount>",
                       (allocator<char> *)&local_220);
            ThrowException(this,local_1a8);
          }
          uVar2 = strtoul10((char *)local_200._0_8_,(char **)local_200);
          *puVar6 = (ulong)uVar2;
          __new_size = __new_size + uVar2;
          SkipSpacesAndLineEnd<char>((char **)local_200);
        }
        TestClosing(this,"vcount");
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::resize(&pController->mWeights,__new_size);
      }
      bVar1 = IsElement(this,"v");
      if ((iVar3 != 0) && (bVar1)) break;
      SkipElement(this);
    }
    local_200._0_8_ = GetTextContent(this);
    for (ppVar7 = (pController->mWeights).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar7 != (pController->mWeights).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar7 = ppVar7 + 1) {
      if (*(char *)local_200._0_8_ == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,"Out of data while reading <vertex_weights>",
                   (allocator<char> *)&local_220);
        ThrowException(this,local_1a8);
      }
      uVar2 = strtoul10((char *)local_200._0_8_,(char **)local_200);
      ppVar7->first = (ulong)uVar2;
      SkipSpacesAndLineEnd<char>((char **)local_200);
      if (*(char *)local_200._0_8_ == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,"Out of data while reading <vertex_weights>",
                   (allocator<char> *)&local_220);
        ThrowException(this,local_1a8);
      }
      uVar2 = strtoul10((char *)local_200._0_8_,(char **)local_200);
      ppVar7->second = (ulong)uVar2;
      SkipSpacesAndLineEnd<char>((char **)local_200);
    }
    TestClosing(this,"v");
  } while( true );
}

Assistant:

void ColladaParser::ReadControllerWeights(Collada::Controller& pController)
{
    // read vertex count from attributes and resize the array accordingly
    int indexCount = GetAttribute("count");
    size_t vertexCount = (size_t)mReader->getAttributeValueAsInt(indexCount);
    pController.mWeightCounts.resize(vertexCount);

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // Input channels for weight data. Two possible semantics: "JOINT" and "WEIGHT"
            if (IsElement("input") && vertexCount > 0)
            {
                InputChannel channel;

                int indexSemantic = GetAttribute("semantic");
                const char* attrSemantic = mReader->getAttributeValue(indexSemantic);
                int indexSource = GetAttribute("source");
                const char* attrSource = mReader->getAttributeValue(indexSource);
                int indexOffset = TestAttribute("offset");
                if (indexOffset >= 0)
                    channel.mOffset = mReader->getAttributeValueAsInt(indexOffset);

                // local URLS always start with a '#'. We don't support global URLs
                if (attrSource[0] != '#')
                    ThrowException(format() << "Unsupported URL format in \"" << attrSource << "\" in source attribute of <vertex_weights> data <input> element");
                channel.mAccessor = attrSource + 1;

                // parse source URL to corresponding source
                if (strcmp(attrSemantic, "JOINT") == 0)
                    pController.mWeightInputJoints = channel;
                else if (strcmp(attrSemantic, "WEIGHT") == 0)
                    pController.mWeightInputWeights = channel;
                else
                    ThrowException(format() << "Unknown semantic \"" << attrSemantic << "\" in <vertex_weights> data <input> element");

                // skip inner data, if present
                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else if (IsElement("vcount") && vertexCount > 0)
            {
                // read weight count per vertex
                const char* text = GetTextContent();
                size_t numWeights = 0;
                for (std::vector<size_t>::iterator it = pController.mWeightCounts.begin(); it != pController.mWeightCounts.end(); ++it)
                {
                    if (*text == 0)
                        ThrowException("Out of data while reading <vcount>");

                    *it = strtoul10(text, &text);
                    numWeights += *it;
                    SkipSpacesAndLineEnd(&text);
                }

                TestClosing("vcount");

                // reserve weight count
                pController.mWeights.resize(numWeights);
            }
            else if (IsElement("v") && vertexCount > 0)
            {
                // read JointIndex - WeightIndex pairs
                const char* text = GetTextContent();

                for (std::vector< std::pair<size_t, size_t> >::iterator it = pController.mWeights.begin(); it != pController.mWeights.end(); ++it)
                {
                    if (*text == 0)
                        ThrowException("Out of data while reading <vertex_weights>");
                    it->first = strtoul10(text, &text);
                    SkipSpacesAndLineEnd(&text);
                    if (*text == 0)
                        ThrowException("Out of data while reading <vertex_weights>");
                    it->second = strtoul10(text, &text);
                    SkipSpacesAndLineEnd(&text);
                }

                TestClosing("v");
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "vertex_weights") != 0)
                ThrowException("Expected end of <vertex_weights> element.");

            break;
        }
    }
}